

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

void __thiscall JSONNode::JSONNode(JSONNode *this,json_string *name_t,char *value_t)

{
  internalJSONNode *piVar1;
  allocator local_41;
  json_string local_40;
  
  piVar1 = internalJSONNode::newInternal('\0');
  this->internal = piVar1;
  std::__cxx11::string::string((string *)&local_40,value_t,&local_41);
  internalJSONNode::Set(piVar1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  piVar1 = this->internal;
  std::__cxx11::string::_M_assign((string *)&piVar1->_name);
  piVar1->_name_encoded = true;
  return;
}

Assistant:

JSONNode::JSONNode(const json_string & name_t, const json_char * value_t) json_nothrow : internal(internalJSONNode::newInternal()){
	   internal -> Set(json_string(value_t));
	   internal -> setname(name_t);
	   LIBJSON_CTOR;
    }